

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

State csv::parse(IDataSource *parser,FieldCallback *emitField,RecordCallback *emitRecord)

{
  bool bVar1;
  uint uVar2;
  double __args_1;
  bool local_b3;
  function<bool_(const_csv::field_&)> local_78;
  size_t local_58;
  size_t row;
  record record;
  InternalState state;
  RecordCallback *emitRecord_local;
  FieldCallback *emitField_local;
  IDataSource *parser_local;
  
  record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = EndOfFile;
  parser->cancelled = false;
  uVar2 = (*parser->_vptr_IDataSource[2])();
  if ((uVar2 & 1) == 0) {
    parser_local._4_4_ = Complete;
  }
  else {
    csv::record::record((record *)&row);
    local_58 = 0;
    do {
      std::vector<csv::field,_std::allocator<csv::field>_>::clear
                ((vector<csv::field,_std::allocator<csv::field>_> *)&record);
      row = local_58;
      std::function<bool_(const_csv::field_&)>::function(&local_78,emitField);
      record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           anon_unknown.dwarf_15825::parseRecord(parser,(record *)&row,&local_78);
      std::function<bool_(const_csv::field_&)>::~function(&local_78);
      if (((parser->skipBlankLines & 1U) == 0) ||
         (bVar1 = csv::record::empty((record *)&row), !bVar1)) {
        local_58 = local_58 + 1;
        bVar1 = std::function::operator_cast_to_bool((function *)emitRecord);
        if (bVar1) {
          (*parser->_vptr_IDataSource[0xc])();
          bVar1 = std::function<bool_(const_csv::record_&,_double)>::operator()
                            (emitRecord,(record *)&row,__args_1);
          if (!bVar1) {
            parser_local._4_4_ = Complete;
            goto LAB_0012cf89;
          }
        }
      }
      uVar2 = (*parser->_vptr_IDataSource[2])();
      if ((uVar2 & 1) == 0) {
        parser_local._4_4_ = Complete;
        goto LAB_0012cf89;
      }
      local_b3 = record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ != Canceled &&
                 record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ != EndOfFile;
    } while (local_b3);
    if (record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == EndOfFile) {
      parser_local._4_4_ = Complete;
    }
    else {
      if (record.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != Canceled) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dagronf[P]csvlib/csvlib/csv/parser.cpp"
                      ,0x111,"State csv::parse(IDataSource &, FieldCallback, RecordCallback)");
      }
      parser_local._4_4_ = Cancelled;
    }
LAB_0012cf89:
    csv::record::~record((record *)&row);
  }
  return parser_local._4_4_;
}

Assistant:

State parse(IDataSource& parser, FieldCallback emitField, RecordCallback emitRecord) {
		//  file = [header CRLF] record *(CRLF record) [CRLF]

		InternalState state = InternalState::EndOfFile;
		parser.cancelled = false;

		// Move to the first character
		if (!parser.next()) {
			// File is empty.  Do nothing
			return State::Complete;
		}

		csv::record record;

		size_t row = 0;
		do {
			record.content.clear();
			record.row = row;

			state = parseRecord(parser, record, emitField);

			if (!parser.skipBlankLines || !record.empty()) {
				row++;
				if (emitRecord && (emitRecord(record, parser.progress()) == false)) {
					return State::Complete;
				}
			}

			if (!parser.next()) {
				return State::Complete;
			}
		}
		while (state != InternalState::Canceled && state != InternalState::EndOfFile);

		switch (state) {
			case InternalState::Canceled:
				return State::Cancelled;
			case InternalState::EndOfFile:
				return State::Complete;
			default:
				assert(false);
				return State::Error;
		}
	}